

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl.c
# Opt level: O2

void * ticket_file_updater(void *unused)

{
  undefined8 uVar1;
  __time_t _Var2;
  int iVar3;
  char *src;
  int *piVar4;
  char *__buf;
  long lVar5;
  h2o_iovec_t hVar6;
  session_ticket_vector_t tickets;
  stat st;
  char errbuf [256];
  char errbuf_1 [256];
  
  lVar5 = 1;
  do {
    __buf = errbuf;
    iVar3 = stat((char *)conf.ticket.vars.generating.cipher,(stat *)&st);
    _Var2 = st.st_mtim.tv_sec;
    uVar1 = conf.ticket.vars.generating.cipher;
    if (iVar3 == 0) {
      if (lVar5 != st.st_mtim.tv_sec) {
        tickets.entries = (st_session_ticket_t **)0x0;
        tickets.size = 0;
        tickets.capacity = 0;
        hVar6 = h2o_file_read((char *)conf.ticket.vars.generating.cipher);
        src = hVar6.base;
        lVar5 = _Var2;
        if (src == (char *)0x0) {
          piVar4 = __errno_location();
          __buf = errbuf_1;
          strerror_r(*piVar4,__buf,0x100);
        }
        else {
          iVar3 = parse_tickets(&tickets,src,hVar6.len,__buf);
          if (iVar3 == 0) {
            if (1 < tickets.size) {
              qsort(tickets.entries,tickets.size,8,ticket_sort_compare);
            }
            pthread_rwlock_wrlock((pthread_rwlock_t *)&session_tickets);
            h2o_mem_swap(&session_tickets.tickets,&tickets,0x18);
            pthread_rwlock_unlock((pthread_rwlock_t *)&session_tickets);
            free(src);
            free_tickets(&tickets);
            fwrite("session ticket secrets have been (re)loaded\n",0x2c,1,_stderr);
            goto LAB_00189187;
          }
        }
        fprintf(_stderr,"failed to load session ticket secrets from file:%s:%s\n",uVar1,__buf);
        free(src);
        free_tickets(&tickets);
      }
    }
    else {
      if (lVar5 != 0) {
        piVar4 = __errno_location();
        strerror_r(*piVar4,__buf,0x100);
        fprintf(_stderr,"cannot load session ticket secrets from file:%s:%s\n",
                conf.ticket.vars.generating.cipher,__buf);
      }
      lVar5 = 0;
    }
LAB_00189187:
    sleep(10);
  } while( true );
}

Assistant:

H2O_NORETURN static void *ticket_file_updater(void *unused)
{
    time_t last_mtime = 1; /* file is loaded if mtime changes, 0 is used to indicate that the file was missing */

    while (1) {
        struct stat st;
        if (stat(conf.ticket.vars.file.filename, &st) != 0) {
            if (last_mtime != 0) {
                char errbuf[256];
                strerror_r(errno, errbuf, sizeof(errbuf));
                fprintf(stderr, "cannot load session ticket secrets from file:%s:%s\n", conf.ticket.vars.file.filename, errbuf);
            }
            last_mtime = 0;
        } else if (last_mtime != st.st_mtime) {
            /* (re)load */
            last_mtime = st.st_mtime;
            if (load_tickets_file(conf.ticket.vars.file.filename) == 0)
                fprintf(stderr, "session ticket secrets have been (re)loaded\n");
        }
        sleep(10);
    }
}